

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

Expr * __thiscall
SQCompilation::SQParser::parseCommaExpr(SQParser *this,SQExpressionContext expression_context)

{
  Arena *this_00;
  CommaExpr *expr;
  Chunk *pCVar1;
  Expr *expr_00;
  CommaExpr *this_01;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  expr = (CommaExpr *)Expression(this,expression_context);
  this_01 = expr;
  if (this->_token == 0x2c) {
    this_00 = this->_astArena;
    pCVar1 = Arena::findChunk(this_00,0x38);
    this_01 = (CommaExpr *)pCVar1->_ptr;
    pCVar1->_ptr = (uint8_t *)(this_01 + 1);
    (this_01->super_Expr).super_Node._op = TO_COMMA;
    (this_01->super_Expr).super_Node._coordinates.lineStart = -1;
    (this_01->super_Expr).super_Node._coordinates.columnStart = -1;
    (this_01->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_01->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_01->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a4950;
    (this_01->_exprs)._arena = this_00;
    (this_01->_exprs)._vals = (Expr **)0x0;
    (this_01->_exprs)._size = 0;
    (this_01->_exprs)._allocated = 0;
    CommaExpr::addExpression(this_01,(Expr *)expr);
    while (this->_token == 0x2c) {
      Lex(this);
      expr_00 = Expression(this,expression_context);
      CommaExpr::addExpression(this_01,expr_00);
    }
  }
  this->_depth = this->_depth - 1;
  return &this_01->super_Expr;
}

Assistant:

Expr* SQParser::parseCommaExpr(SQExpressionContext expression_context)
{
    NestingChecker nc(this);
    Expr *expr = Expression(expression_context);

    if (_token == ',') {
        CommaExpr *cm = newNode<CommaExpr>(arena());
        cm->addExpression(expr);
        expr = cm;
        while (_token == ',') {
            Lex();
            cm->addExpression(Expression(expression_context));
        }
    }

    return expr;
}